

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cc
# Opt level: O0

void __thiscall xemmai::t_io::f_scan(t_io *this,t_scan a_scan)

{
  t_object *ptVar1;
  t_scan a_scan_local;
  t_io *this_local;
  
  ptVar1 = t_slot::operator_cast_to_t_object_(&this->v_symbol_close);
  (*a_scan)(ptVar1);
  ptVar1 = t_slot::operator_cast_to_t_object_(&this->v_symbol_read);
  (*a_scan)(ptVar1);
  ptVar1 = t_slot::operator_cast_to_t_object_(&this->v_symbol_write);
  (*a_scan)(ptVar1);
  ptVar1 = t_slot::operator_cast_to_t_object_(&this->v_symbol_flush);
  (*a_scan)(ptVar1);
  ptVar1 = t_slot::operator_cast_to_t_object_(&this->v_symbol_read_line);
  (*a_scan)(ptVar1);
  ptVar1 = t_slot::operator_cast_to_t_object_(&this->v_symbol_write_line);
  (*a_scan)(ptVar1);
  ptVar1 = t_slot::operator_cast_to_t_object_(&this->v_symbol_resume);
  (*a_scan)(ptVar1);
  ptVar1 = t_slot_of::operator_cast_to_t_object_((t_slot_of *)&this->v_type_file);
  (*a_scan)(ptVar1);
  ptVar1 = t_slot_of::operator_cast_to_t_object_((t_slot_of *)&this->v_type_reader);
  (*a_scan)(ptVar1);
  ptVar1 = t_slot_of::operator_cast_to_t_object_((t_slot_of *)&this->v_type_writer);
  (*a_scan)(ptVar1);
  return;
}

Assistant:

void t_io::f_scan(t_scan a_scan)
{
	a_scan(v_symbol_close);
	a_scan(v_symbol_read);
	a_scan(v_symbol_write);
	a_scan(v_symbol_flush);
	a_scan(v_symbol_read_line);
	a_scan(v_symbol_write_line);
	a_scan(v_symbol_resume);
	a_scan(v_type_file);
	a_scan(v_type_reader);
	a_scan(v_type_writer);
}